

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar5.c
# Opt level: O0

wchar_t read_consume_bits(archive_read *a,rar5 *rar,uint8_t *p,wchar_t n,wchar_t *value)

{
  char cVar1;
  wchar_t num;
  wchar_t ret;
  uint16_t v;
  wchar_t *value_local;
  uint8_t *puStack_28;
  wchar_t n_local;
  uint8_t *p_local;
  rar5 *rar_local;
  archive_read *a_local;
  
  if ((n == L'\0') || (L'\x10' < n)) {
    a_local._4_4_ = L'\xffffffe2';
  }
  else {
    _ret = value;
    value_local._4_4_ = n;
    puStack_28 = p;
    p_local = (uint8_t *)rar;
    rar_local = (rar5 *)a;
    a_local._4_4_ = read_bits_16(a,rar,p,(uint16_t *)((long)&num + 2));
    if (a_local._4_4_ == L'\0') {
      cVar1 = (char)value_local._4_4_;
      skip_bits((rar5 *)p_local,value_local._4_4_);
      if (_ret != (wchar_t *)0x0) {
        *_ret = (int)(uint)num._2_2_ >> (0x10U - cVar1 & 0x1f);
      }
      a_local._4_4_ = L'\0';
    }
  }
  return a_local._4_4_;
}

Assistant:

static int read_consume_bits(struct archive_read* a, struct rar5* rar,
	const uint8_t* p, int n, int* value)
{
	uint16_t v;
	int ret, num;

	if(n == 0 || n > 16) {
		/* This is a programmer error and should never happen
		 * in runtime. */
		return ARCHIVE_FATAL;
	}

	ret = read_bits_16(a, rar, p, &v);
	if(ret != ARCHIVE_OK)
		return ret;

	num = (int) v;
	num >>= 16 - n;

	skip_bits(rar, n);

	if(value)
		*value = num;

	return ARCHIVE_OK;
}